

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O0

void jpeg_mem_dest(j_compress_ptr cinfo,uchar **outbuffer,unsigned_long *outsize)

{
  long *plVar1;
  long lVar2;
  void *pvVar3;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  my_mem_dest_ptr dest;
  
  if ((in_RSI == (long *)0x0) || (in_RDX == (long *)0x0)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x18;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (in_RDI[5] == 0) {
    lVar2 = (**(code **)in_RDI[1])(in_RDI,0,0x50);
    in_RDI[5] = lVar2;
  }
  plVar1 = (long *)in_RDI[5];
  plVar1[2] = (long)init_mem_destination;
  plVar1[3] = (long)empty_mem_output_buffer;
  plVar1[4] = (long)term_mem_destination;
  plVar1[5] = (long)in_RSI;
  plVar1[6] = (long)in_RDX;
  plVar1[7] = 0;
  if ((*in_RSI == 0) || (*in_RDX == 0)) {
    pvVar3 = malloc(0x1000);
    *in_RSI = (long)pvVar3;
    plVar1[7] = (long)pvVar3;
    if (plVar1[7] == 0) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x38;
      *(undefined4 *)(*in_RDI + 0x2c) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
    *in_RDX = 0x1000;
  }
  lVar2 = *in_RSI;
  plVar1[8] = lVar2;
  *plVar1 = lVar2;
  lVar2 = *in_RDX;
  plVar1[9] = lVar2;
  plVar1[1] = lVar2;
  return;
}

Assistant:

GLOBAL(void)
jpeg_mem_dest (j_compress_ptr cinfo,
	       unsigned char ** outbuffer, unsigned long * outsize)
{
  my_mem_dest_ptr dest;

  if (outbuffer == NULL || outsize == NULL)	/* sanity check */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);

  /* The destination object is made permanent so that multiple JPEG images
   * can be written to the same buffer without re-executing jpeg_mem_dest.
   */
  if (cinfo->dest == NULL) {	/* first time for this JPEG object? */
    cinfo->dest = (struct jpeg_destination_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
				  SIZEOF(my_mem_destination_mgr));
  }

  dest = (my_mem_dest_ptr) cinfo->dest;
  dest->pub.init_destination = init_mem_destination;
  dest->pub.empty_output_buffer = empty_mem_output_buffer;
  dest->pub.term_destination = term_mem_destination;
  dest->outbuffer = outbuffer;
  dest->outsize = outsize;
  dest->newbuffer = NULL;

  if (*outbuffer == NULL || *outsize == 0) {
    /* Allocate initial buffer */
    dest->newbuffer = *outbuffer = (unsigned char *) malloc(OUTPUT_BUF_SIZE);
    if (dest->newbuffer == NULL)
      ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 10);
    *outsize = OUTPUT_BUF_SIZE;
  }

  dest->pub.next_output_byte = dest->buffer = *outbuffer;
  dest->pub.free_in_buffer = dest->bufsize = *outsize;
}